

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

bool __thiscall
caffe::SoftmaxParameter::MergePartialFromCodedStream(SoftmaxParameter *this,CodedInputStream *input)

{
  InternalMetadataWithArena *this_00;
  byte bVar1;
  byte *pbVar2;
  void *pvVar3;
  ulong uVar4;
  uint32 uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong unaff_RBP;
  UnknownFieldSet *pUVar9;
  ulong uVar10;
  bool bVar11;
  
  this_00 = &this->_internal_metadata_;
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003b1f47;
      input->buffer_ = pbVar2 + 1;
      uVar10 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003b1f47:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar10 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar10 = 0x100000000;
      }
      uVar10 = uVar5 | uVar10;
    }
    uVar8 = (uint)uVar10;
    if ((uVar10 & 0x100000000) == 0) {
LAB_003b1fd5:
      if ((uVar8 & 7) == 4 || uVar8 == 0) {
        iVar7 = 7;
      }
      else {
        pvVar3 = (this_00->
                 super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 ).ptr_;
        if (((ulong)pvVar3 & 1) == 0) {
          pUVar9 = google::protobuf::internal::
                   InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   ::mutable_unknown_fields_slow
                             (&this_00->
                               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                             );
        }
        else {
          pUVar9 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
        }
        bVar11 = google::protobuf::internal::WireFormat::SkipField(input,uVar8,pUVar9);
        iVar7 = 6;
        if (bVar11) goto LAB_003b200e;
      }
    }
    else {
      uVar6 = (uint)(uVar10 >> 3) & 0x1fffffff;
      if (uVar6 == 2) {
        if ((char)uVar10 != '\x10') goto LAB_003b1fd5;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar10 = (ulong)bVar1;
          uVar5 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_003b207b;
          input->buffer_ = pbVar2 + 1;
          bVar11 = true;
        }
        else {
          uVar5 = 0;
LAB_003b207b:
          uVar10 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
          bVar11 = -1 < (long)uVar10;
        }
        if (bVar11) {
          this->axis_ = (int32)uVar10;
          goto LAB_003b200e;
        }
        iVar7 = 6;
        goto LAB_003b2010;
      }
      if ((uVar6 != 1) || ((char)uVar10 != '\b')) goto LAB_003b1fd5;
      pbVar2 = input->buffer_;
      if (pbVar2 < input->buffer_end_) {
        bVar1 = *pbVar2;
        uVar10 = (ulong)bVar1;
        uVar5 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_003b202c;
        input->buffer_ = pbVar2 + 1;
        bVar11 = true;
      }
      else {
        uVar5 = 0;
LAB_003b202c:
        uVar10 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
        bVar11 = -1 < (long)uVar10;
      }
      iVar7 = 6;
      uVar4 = unaff_RBP;
      if (bVar11) {
        uVar4 = uVar10;
      }
      unaff_RBP = uVar4 & 0xffffffff;
      if (bVar11) {
        uVar8 = (uint)uVar4;
        if (uVar8 < 3) {
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
          this->engine_ = uVar8;
        }
        else {
          pvVar3 = (this_00->
                   super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   ).ptr_;
          if (((ulong)pvVar3 & 1) == 0) {
            pUVar9 = google::protobuf::internal::
                     InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                     ::mutable_unknown_fields_slow
                               (&this_00->
                                 super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                               );
          }
          else {
            pUVar9 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
          }
          google::protobuf::UnknownFieldSet::AddVarint(pUVar9,1,(long)(int)uVar8);
        }
        iVar7 = 0;
      }
      if (bVar11) {
LAB_003b200e:
        iVar7 = 0;
      }
    }
LAB_003b2010:
    if (iVar7 != 0) {
      return iVar7 != 6;
    }
  } while( true );
}

Assistant:

bool SoftmaxParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.SoftmaxParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional .caffe.SoftmaxParameter.Engine engine = 1 [default = DEFAULT];
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::caffe::SoftmaxParameter_Engine_IsValid(value)) {
            set_engine(static_cast< ::caffe::SoftmaxParameter_Engine >(value));
          } else {
            mutable_unknown_fields()->AddVarint(1, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional int32 axis = 2 [default = 1];
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          set_has_axis();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int32, ::google::protobuf::internal::WireFormatLite::TYPE_INT32>(
                 input, &axis_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.SoftmaxParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.SoftmaxParameter)
  return false;
#undef DO_
}